

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.cpp
# Opt level: O2

mz_ulong mz_crc32(mz_ulong crc,mz_uint8 *ptr,size_t buf_len)

{
  uint uVar1;
  mz_ulong mVar2;
  size_t sVar3;
  
  if (ptr == (mz_uint8 *)0x0) {
    mVar2 = 0;
  }
  else {
    uVar1 = ~(uint)crc;
    for (sVar3 = 0; buf_len != sVar3; sVar3 = sVar3 + 1) {
      uVar1 = uVar1 >> 4 ^ mz_crc32::s_crc32[(uVar1 ^ ptr[sVar3]) & 0xf];
      uVar1 = uVar1 >> 4 ^ mz_crc32::s_crc32[(uint)(ptr[sVar3] >> 4) ^ uVar1 & 0xf];
    }
    mVar2 = (mz_ulong)~uVar1;
  }
  return mVar2;
}

Assistant:

mz_ulong mz_crc32(mz_ulong crc, const mz_uint8 *ptr, size_t buf_len)
{
    static const mz_uint32 s_crc32[16] = {0,          0x1db71064, 0x3b6e20c8, 0x26d930ac,
                                          0x76dc4190, 0x6b6b51f4, 0x4db26158, 0x5005713c,
                                          0xedb88320, 0xf00f9344, 0xd6d6a3e8, 0xcb61b38c,
                                          0x9b64c2b0, 0x86d3d2d4, 0xa00ae278, 0xbdbdf21c};
    mz_uint32 crcu32 = (mz_uint32)crc;
    if (!ptr)
        return MZ_CRC32_INIT;
    crcu32 = ~crcu32;
    while (buf_len--)
    {
        mz_uint8 b = *ptr++;
        crcu32 = (crcu32 >> 4) ^ s_crc32[(crcu32 & 0xF) ^ (b & 0xF)];
        crcu32 = (crcu32 >> 4) ^ s_crc32[(crcu32 & 0xF) ^ (b >> 4)];
    }
    return ~crcu32;
}